

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,CodeLocation *code_location)

{
  Message *pMVar1;
  ostream *poVar2;
  internal *this;
  int line;
  string local_70;
  string local_50;
  GTestLog local_30 [4];
  Message local_20;
  Message errors;
  CodeLocation *code_location_local;
  char *test_case_name_local;
  
  errors.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )code_location;
  code_location_local = (CodeLocation *)test_case_name;
  Message::Message(&local_20);
  pMVar1 = Message::operator<<(&local_20,(char (*) [37])"Attempted redefinition of test case ");
  pMVar1 = Message::operator<<(pMVar1,(char **)&code_location_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x19bd73);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [64])
                                      "All tests in the same test case must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [31])"class.  However, in test case ");
  pMVar1 = Message::operator<<(pMVar1,(char **)&code_location_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [12])0x19ba88);
  line = 0xfe8;
  GTestLog::GTestLog(local_30,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/gtest/src/gtest-all.cc"
                     ,0xfe8);
  poVar2 = GTestLog::GetStream(local_30);
  this = (internal *)std::__cxx11::string::c_str();
  FormatFileLocation_abi_cxx11_(&local_50,this,(char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2," ");
  Message::GetString_abi_cxx11_(&local_70,&local_20);
  std::operator<<(poVar2,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  GTestLog::~GTestLog(local_30);
  Message::~Message(&local_20);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}